

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86_fma::create_pipeline(Convolution1D_x86_fma *this,Option *param_1)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  _func_int *p_Var4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  undefined4 *puVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  undefined4 *puVar20;
  int k_5;
  uint uVar21;
  int iVar22;
  int k_2;
  ulong uVar23;
  undefined4 *puVar24;
  int iVar25;
  uint _w;
  int iVar26;
  long lVar27;
  int iVar28;
  int k_4;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  bool bVar34;
  int iVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  undefined4 *puVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  int k;
  ulong uVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  ulong uVar49;
  long lVar50;
  int k_3;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  int iVar55;
  long local_158;
  long local_150;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  ulong local_120;
  
  p_Var4 = this->_vptr_Convolution1D_x86_fma[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var4) != 0) {
    return 0;
  }
  uVar2 = *(uint *)(&this->field_0xd4 + (long)p_Var4);
  lVar51 = (long)(int)uVar2;
  uVar45 = (ulong)uVar2;
  uVar23 = (long)*(int *)(&this->field_0xf0 + (long)p_Var4) / (long)(int)uVar2;
  uVar3 = *(uint *)(&this->field_0xd0 + (long)p_Var4);
  uVar36 = (ulong)(int)uVar3;
  uVar23 = (long)((ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 | uVar23 & 0xffffffff) /
           (long)(int)uVar3;
  uVar33 = uVar23 & 0xffffffff;
  uVar10 = (uint)uVar23;
  if ((long)uVar36 < 8) {
    uVar21 = uVar10;
    if ((int)uVar3 < 4) {
      if ((int)uVar3 < 2) {
        uVar19 = uVar3;
        if ((int)uVar10 < 8) {
          if ((int)uVar10 < 4) {
            _w = uVar2;
            if (1 < (int)uVar10) {
              _w = uVar2 * 2;
              uVar21 = (uVar10 & 1) + 1;
            }
          }
          else {
            _w = uVar2 * 4;
            uVar21 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
          }
        }
        else {
          _w = uVar2 * 8;
          uVar21 = (uVar10 & 1) + (int)(uVar33 >> 3) + ((uint)(uVar33 >> 2) & 1) +
                   (uint)((uVar10 >> 1 & 1) != 0);
        }
      }
      else {
        if ((int)uVar10 < 8) {
          if ((int)uVar10 < 4) {
            if ((int)uVar10 < 2) {
              _w = uVar2 * 2;
              uVar19 = (uVar3 & 1) + 1;
              goto LAB_004fc5a9;
            }
            _w = uVar2 * 4;
            uVar21 = (uVar10 & 1) + 1;
          }
          else {
            uVar21 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
            _w = uVar2 * 8;
          }
        }
        else {
          _w = uVar2 << 4;
          uVar21 = (uVar10 & 1) + (int)(uVar33 >> 3) + ((uint)(uVar33 >> 2) & 1) +
                   (uint)((uVar10 >> 1 & 1) != 0);
        }
        uVar19 = (uVar3 & 1) + 1;
      }
    }
    else {
      if ((int)uVar10 < 8) {
        if ((int)uVar10 < 4) {
          if ((int)uVar10 < 2) {
            _w = uVar2 * 4;
            uVar19 = (uVar3 & 1) + 1 + (uint)((uVar3 >> 1 & 1) != 0);
            goto LAB_004fc5a9;
          }
          _w = uVar2 * 8;
          uVar21 = (uVar10 & 1) + 1;
        }
        else {
          _w = uVar2 << 4;
          uVar21 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
        }
      }
      else {
        _w = uVar2 << 5;
        uVar21 = (uVar10 & 1) + (int)(uVar33 >> 3) + ((uint)(uVar33 >> 2) & 1) +
                 (uint)((uVar10 >> 1 & 1) != 0);
      }
      uVar19 = (uVar3 & 1) + 1 + (uint)((uVar3 >> 1 & 1) != 0);
    }
LAB_004fc5a9:
    uVar23 = 0;
    Mat::create(&this->weight_data_tm,_w,uVar21,uVar19,4,(Allocator *)0x0);
    goto LAB_004fc5b1;
  }
  if ((int)uVar10 < 8) {
    if (3 < (int)uVar10) {
      iVar25 = uVar2 << 5;
      uVar21 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
      goto LAB_004fbd1d;
    }
    if (1 < (int)uVar10) {
      iVar25 = uVar2 << 4;
      uVar21 = (uVar10 & 1) + 1;
      goto LAB_004fbd1d;
    }
    iVar25 = uVar2 * 8;
    iVar18 = (uVar3 & 1) + (uVar3 >> 3) + ((uint)(uVar36 >> 2) & 1) + (uint)((uVar3 >> 1 & 1) != 0);
    uVar21 = uVar10;
  }
  else {
    iVar25 = uVar2 << 6;
    uVar21 = (uVar10 & 1) + (uVar10 >> 3) + ((uint)((uVar23 & 0xffffffff) >> 2) & 1) +
             (uint)((uVar10 >> 1 & 1) != 0);
LAB_004fbd1d:
    iVar18 = (uVar3 & 1) + (uVar3 >> 3) + (uVar3 >> 2 & 1) + (uint)((uVar3 >> 1 & 1) != 0);
  }
  Mat::create(&this->weight_data_tm,iVar25,uVar21,iVar18,4,(Allocator *)0x0);
  lVar5 = *(long *)(&this->field_0x148 + (long)p_Var4);
  iVar22 = uVar10 * uVar2;
  sVar6 = (this->weight_data_tm).elemsize;
  sVar7 = (this->weight_data_tm).cstep;
  pvVar8 = (this->weight_data_tm).data;
  lVar12 = (long)(int)uVar10;
  iVar26 = uVar2 * uVar10;
  iVar25 = iVar26 * 8;
  lVar1 = lVar51 * 4;
  iVar35 = iVar26 * 2;
  iVar18 = iVar26 * 3;
  iVar26 = iVar26 * 4;
  iVar11 = uVar2 * uVar10;
  iVar28 = iVar11 * 5;
  iVar29 = iVar11 * 6;
  iVar11 = iVar11 * 7;
  iVar55 = 0;
  uVar33 = 0;
  do {
    puVar13 = (undefined4 *)((uVar33 >> 3) * sVar6 * sVar7 + (long)pvVar8);
    if ((int)uVar10 < 8) {
      uVar23 = 0;
    }
    else {
      lVar42 = 0;
      uVar49 = 0;
      do {
        if (0 < (int)uVar2) {
          uVar23 = 0;
          lVar52 = lVar42;
          do {
            puVar24 = puVar13;
            lVar46 = 0;
            lVar14 = lVar52;
            do {
              *(undefined4 *)((long)puVar24 + lVar46) =
                   *(undefined4 *)(lVar5 + (long)iVar55 * 4 + lVar14);
              *(undefined4 *)((long)puVar24 + lVar46 + 4) =
                   *(undefined4 *)(lVar5 + (long)iVar22 * 4 + lVar14);
              *(undefined4 *)((long)puVar24 + lVar46 + 8) =
                   *(undefined4 *)(lVar5 + (long)iVar35 * 4 + lVar14);
              *(undefined4 *)((long)puVar24 + lVar46 + 0xc) =
                   *(undefined4 *)(lVar5 + (long)iVar18 * 4 + lVar14);
              *(undefined4 *)((long)puVar24 + lVar46 + 0x10) =
                   *(undefined4 *)(lVar5 + (long)iVar26 * 4 + lVar14);
              *(undefined4 *)((long)puVar24 + lVar46 + 0x14) =
                   *(undefined4 *)(lVar5 + (long)iVar28 * 4 + lVar14);
              *(undefined4 *)((long)puVar24 + lVar46 + 0x18) =
                   *(undefined4 *)(lVar5 + (long)iVar29 * 4 + lVar14);
              *(undefined4 *)((long)puVar24 + lVar46 + 0x1c) =
                   *(undefined4 *)(lVar5 + (long)iVar11 * 4 + lVar14);
              lVar46 = lVar46 + 0x20;
              lVar14 = lVar14 + lVar1;
            } while ((int)lVar46 != 0x100);
            uVar23 = uVar23 + 1;
            lVar52 = lVar52 + 4;
            puVar13 = (undefined4 *)((long)puVar24 + lVar46);
          } while (uVar23 != uVar45);
          puVar13 = (undefined4 *)((long)puVar24 + lVar46);
        }
        uVar23 = uVar49 + 8;
        lVar52 = uVar49 + 0xf;
        lVar42 = lVar42 + uVar45 * 0x20;
        uVar49 = uVar23;
      } while (lVar52 < lVar12);
    }
    lVar14 = (long)iVar11 * 4;
    lVar52 = (long)iVar29 * 4;
    lVar46 = (long)iVar28 * 4;
    lVar30 = (long)iVar26 * 4;
    lVar43 = (long)iVar18 * 4;
    lVar37 = (long)iVar35 * 4;
    lVar42 = (long)iVar22 * 4;
    lVar47 = (long)iVar55 * 4;
    if ((int)((uint)uVar23 | 3) < (int)uVar10) {
      lVar48 = lVar1 * (uVar23 & 0xffffffff);
      lVar39 = 0;
      uVar49 = uVar23 & 0xffffffff;
      do {
        if (0 < (int)uVar2) {
          uVar23 = 0;
          lVar53 = lVar39;
          do {
            puVar24 = puVar13;
            lVar38 = 0;
            lVar15 = lVar53;
            do {
              *(undefined4 *)((long)puVar24 + lVar38) =
                   *(undefined4 *)(lVar47 + lVar48 + lVar5 + lVar15);
              *(undefined4 *)((long)puVar24 + lVar38 + 4) =
                   *(undefined4 *)(lVar42 + lVar48 + lVar5 + lVar15);
              *(undefined4 *)((long)puVar24 + lVar38 + 8) =
                   *(undefined4 *)(lVar37 + lVar48 + lVar5 + lVar15);
              *(undefined4 *)((long)puVar24 + lVar38 + 0xc) =
                   *(undefined4 *)(lVar48 + lVar43 + lVar5 + lVar15);
              *(undefined4 *)((long)puVar24 + lVar38 + 0x10) =
                   *(undefined4 *)(lVar48 + lVar30 + lVar5 + lVar15);
              *(undefined4 *)((long)puVar24 + lVar38 + 0x14) =
                   *(undefined4 *)(lVar46 + lVar48 + lVar5 + lVar15);
              *(undefined4 *)((long)puVar24 + lVar38 + 0x18) =
                   *(undefined4 *)(lVar52 + lVar48 + lVar5 + lVar15);
              *(undefined4 *)((long)puVar24 + lVar38 + 0x1c) =
                   *(undefined4 *)(lVar48 + lVar14 + lVar5 + lVar15);
              lVar38 = lVar38 + 0x20;
              lVar15 = lVar15 + lVar1;
            } while ((int)lVar38 != 0x80);
            uVar23 = uVar23 + 1;
            lVar53 = lVar53 + 4;
            puVar13 = (undefined4 *)((long)puVar24 + lVar38);
          } while (uVar23 != uVar45);
          puVar13 = (undefined4 *)((long)puVar24 + lVar38);
        }
        uVar23 = uVar49 + 4;
        lVar53 = uVar49 + 7;
        lVar39 = lVar39 + lVar51 * 0x10;
        uVar49 = uVar23;
      } while (lVar53 < lVar12);
    }
    if ((int)((uint)uVar23 | 1) < (int)uVar10) {
      lVar48 = lVar1 * (uVar23 & 0xffffffff);
      lVar39 = 0;
      uVar49 = uVar23 & 0xffffffff;
      do {
        if (0 < (int)uVar2) {
          uVar23 = 0;
          lVar53 = lVar39;
          do {
            lVar15 = lVar53;
            bVar9 = true;
            do {
              bVar34 = bVar9;
              *puVar13 = *(undefined4 *)(lVar47 + lVar48 + lVar5 + lVar15);
              puVar13[1] = *(undefined4 *)(lVar48 + lVar42 + lVar5 + lVar15);
              puVar13[2] = *(undefined4 *)(lVar48 + lVar37 + lVar5 + lVar15);
              puVar13[3] = *(undefined4 *)(lVar48 + lVar43 + lVar5 + lVar15);
              puVar13[4] = *(undefined4 *)(lVar48 + lVar30 + lVar5 + lVar15);
              puVar13[5] = *(undefined4 *)(lVar46 + lVar48 + lVar5 + lVar15);
              puVar13[6] = *(undefined4 *)(lVar48 + lVar52 + lVar5 + lVar15);
              puVar13[7] = *(undefined4 *)(lVar48 + lVar14 + lVar5 + lVar15);
              puVar13 = puVar13 + 8;
              lVar15 = lVar15 + lVar1;
              bVar9 = false;
            } while (bVar34);
            uVar23 = uVar23 + 1;
            lVar53 = lVar53 + 4;
          } while (uVar23 != uVar45);
        }
        uVar23 = uVar49 + 2;
        lVar53 = uVar49 + 3;
        lVar39 = lVar39 + lVar51 * 8;
        uVar49 = uVar23;
      } while (lVar53 < lVar12);
    }
    if ((int)uVar23 < (int)uVar10) {
      lVar53 = (long)(int)uVar23;
      lVar39 = lVar1 * lVar53;
      lVar48 = lVar14 + lVar39 + lVar5;
      lVar14 = lVar52 + lVar39 + lVar5;
      lVar52 = lVar46 + lVar39 + lVar5;
      lVar30 = lVar30 + lVar39 + lVar5;
      lVar43 = lVar43 + lVar39 + lVar5;
      lVar46 = lVar37 + lVar39 + lVar5;
      lVar37 = lVar42 + lVar39 + lVar5;
      lVar42 = lVar39 + lVar47 + lVar5;
      do {
        if (0 < (int)uVar2) {
          lVar47 = 0;
          puVar24 = puVar13;
          do {
            puVar41 = puVar24;
            puVar24 = puVar13 + lVar47 * 2;
            *puVar24 = *(undefined4 *)(lVar42 + lVar47);
            puVar24[1] = *(undefined4 *)(lVar37 + lVar47);
            puVar24[2] = *(undefined4 *)(lVar46 + lVar47);
            puVar24[3] = *(undefined4 *)(lVar43 + lVar47);
            puVar24[4] = *(undefined4 *)(lVar30 + lVar47);
            puVar24[5] = *(undefined4 *)(lVar52 + lVar47);
            puVar24[6] = *(undefined4 *)(lVar14 + lVar47);
            puVar24[7] = *(undefined4 *)(lVar48 + lVar47);
            lVar47 = lVar47 + 4;
            puVar24 = puVar24 + 8;
          } while (uVar45 * 4 != lVar47);
          puVar13 = puVar41 + 8;
        }
        lVar53 = lVar53 + 1;
        lVar48 = lVar48 + lVar1;
        lVar14 = lVar14 + lVar1;
        lVar52 = lVar52 + lVar1;
        lVar30 = lVar30 + lVar1;
        lVar43 = lVar43 + lVar1;
        lVar46 = lVar46 + lVar1;
        lVar37 = lVar37 + lVar1;
        lVar42 = lVar42 + lVar1;
      } while (lVar53 != lVar12);
    }
    uVar23 = uVar33 + 8;
    uVar49 = uVar33 + 0xf;
    iVar55 = iVar55 + iVar25;
    iVar22 = iVar22 + iVar25;
    iVar35 = iVar35 + iVar25;
    iVar18 = iVar18 + iVar25;
    iVar26 = iVar26 + iVar25;
    iVar28 = iVar28 + iVar25;
    iVar29 = iVar29 + iVar25;
    iVar11 = iVar11 + iVar25;
    uVar33 = uVar23;
  } while (uVar49 < uVar36);
LAB_004fc5b1:
  uVar21 = (uint)uVar23;
  if ((int)(uVar21 | 3) < (int)uVar3) {
    lVar12 = *(long *)(&this->field_0x148 + (long)p_Var4);
    pvVar8 = (this->weight_data_tm).data;
    sVar6 = (this->weight_data_tm).elemsize;
    sVar7 = (this->weight_data_tm).cstep;
    lVar42 = (long)(int)uVar10;
    iVar18 = uVar2 * uVar10;
    iVar28 = (uVar21 | 3) * iVar18;
    iVar25 = iVar18 * 4;
    lVar52 = uVar45 * 0x20;
    lVar1 = lVar51 * 4;
    iVar18 = (uVar21 + 2) * iVar18;
    iVar29 = (uVar21 + 1) * uVar2 * uVar10;
    iVar35 = uVar21 * uVar2 * uVar10;
    lVar5 = lVar51 * 8;
    uVar33 = uVar23 & 0xffffffff;
    do {
      puVar13 = (undefined4 *)
                ((ulong)(((uint)(uVar33 >> 3) & 0x1fffffff) + (uint)(((uint)uVar33 >> 2 & 1) != 0))
                 * sVar6 * sVar7 + (long)pvVar8);
      if ((int)uVar10 < 8) {
        uVar23 = 0;
      }
      else {
        lVar14 = lVar12 + (long)iVar28 * 4;
        lVar46 = lVar12 + (long)iVar18 * 4;
        lVar30 = lVar12 + (long)iVar29 * 4;
        lVar37 = lVar12 + (long)iVar35 * 4;
        uVar49 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar23 = 0;
            lVar43 = lVar37;
            lVar47 = lVar30;
            lVar39 = lVar46;
            lVar48 = lVar14;
            do {
              puVar24 = puVar13;
              lVar15 = 0;
              lVar53 = 0;
              do {
                *(undefined4 *)((long)puVar24 + lVar53) = *(undefined4 *)(lVar43 + lVar15);
                *(undefined4 *)((long)puVar24 + lVar53 + 4) = *(undefined4 *)(lVar47 + lVar15);
                *(undefined4 *)((long)puVar24 + lVar53 + 8) = *(undefined4 *)(lVar39 + lVar15);
                *(undefined4 *)((long)puVar24 + lVar53 + 0xc) = *(undefined4 *)(lVar48 + lVar15);
                lVar53 = lVar53 + 0x10;
                lVar15 = lVar15 + lVar1;
              } while ((int)lVar53 != 0x80);
              uVar23 = uVar23 + 1;
              lVar48 = lVar48 + 4;
              lVar39 = lVar39 + 4;
              lVar47 = lVar47 + 4;
              lVar43 = lVar43 + 4;
              puVar13 = (undefined4 *)((long)puVar24 + lVar53);
            } while (uVar23 != uVar45);
            puVar13 = (undefined4 *)((long)puVar24 + lVar53);
          }
          uVar23 = uVar49 + 8;
          lVar43 = uVar49 + 0xf;
          lVar14 = lVar14 + lVar52;
          lVar46 = lVar46 + lVar52;
          lVar30 = lVar30 + lVar52;
          lVar37 = lVar37 + lVar52;
          uVar49 = uVar23;
        } while (lVar43 < lVar42);
      }
      lVar30 = (long)iVar28 * 4;
      lVar37 = (long)iVar18 * 4;
      lVar14 = (long)iVar29 * 4;
      lVar46 = (long)iVar35 * 4;
      if ((int)((uint)uVar23 | 3) < (int)uVar10) {
        lVar43 = lVar1 * (uVar23 & 0xffffffff);
        lVar47 = 0;
        uVar49 = uVar23 & 0xffffffff;
        do {
          if (0 < (int)uVar2) {
            uVar23 = 0;
            lVar39 = lVar47;
            do {
              puVar24 = puVar13;
              lVar53 = 0;
              lVar48 = lVar39;
              do {
                *(undefined4 *)((long)puVar24 + lVar53) =
                     *(undefined4 *)(lVar43 + lVar46 + lVar12 + lVar48);
                *(undefined4 *)((long)puVar24 + lVar53 + 4) =
                     *(undefined4 *)(lVar43 + lVar14 + lVar12 + lVar48);
                *(undefined4 *)((long)puVar24 + lVar53 + 8) =
                     *(undefined4 *)(lVar43 + lVar37 + lVar12 + lVar48);
                *(undefined4 *)((long)puVar24 + lVar53 + 0xc) =
                     *(undefined4 *)(lVar43 + lVar30 + lVar12 + lVar48);
                lVar53 = lVar53 + 0x10;
                lVar48 = lVar48 + lVar1;
              } while ((int)lVar53 != 0x40);
              uVar23 = uVar23 + 1;
              lVar39 = lVar39 + 4;
              puVar13 = (undefined4 *)((long)puVar24 + lVar53);
            } while (uVar23 != uVar45);
            puVar13 = (undefined4 *)((long)puVar24 + lVar53);
          }
          uVar23 = uVar49 + 4;
          lVar39 = uVar49 + 7;
          lVar47 = lVar47 + lVar51 * 0x10;
          uVar49 = uVar23;
        } while (lVar39 < lVar42);
      }
      if ((int)((uint)uVar23 | 1) < (int)uVar10) {
        lVar48 = lVar1 * (uVar23 & 0xffffffff);
        lVar47 = lVar30 + lVar48 + lVar12;
        lVar39 = lVar48 + lVar37 + lVar12;
        lVar43 = lVar48 + lVar14 + lVar12;
        lVar48 = lVar48 + lVar46 + lVar12;
        uVar49 = uVar23 & 0xffffffff;
        do {
          if (0 < (int)uVar2) {
            uVar23 = 0;
            lVar53 = lVar39;
            lVar15 = lVar47;
            lVar38 = lVar48;
            lVar54 = lVar43;
            do {
              lVar31 = 0;
              bVar9 = true;
              do {
                bVar34 = bVar9;
                *puVar13 = *(undefined4 *)(lVar38 + lVar31);
                puVar13[1] = *(undefined4 *)(lVar54 + lVar31);
                puVar13[2] = *(undefined4 *)(lVar53 + lVar31);
                puVar13[3] = *(undefined4 *)(lVar15 + lVar31);
                puVar13 = puVar13 + 4;
                lVar31 = lVar31 + lVar1;
                bVar9 = false;
              } while (bVar34);
              uVar23 = uVar23 + 1;
              lVar15 = lVar15 + 4;
              lVar53 = lVar53 + 4;
              lVar54 = lVar54 + 4;
              lVar38 = lVar38 + 4;
            } while (uVar23 != uVar45);
          }
          uVar23 = uVar49 + 2;
          lVar53 = uVar49 + 3;
          lVar47 = lVar47 + lVar5;
          lVar39 = lVar39 + lVar5;
          lVar43 = lVar43 + lVar5;
          lVar48 = lVar48 + lVar5;
          uVar49 = uVar23;
        } while (lVar53 < lVar42);
      }
      if ((int)uVar23 < (int)uVar10) {
        lVar43 = (long)(int)uVar23;
        lVar47 = lVar1 * lVar43;
        lVar30 = lVar30 + lVar47 + lVar12;
        lVar37 = lVar37 + lVar47 + lVar12;
        lVar14 = lVar14 + lVar47 + lVar12;
        lVar46 = lVar47 + lVar46 + lVar12;
        do {
          if (0 < (int)uVar2) {
            lVar47 = 0;
            puVar24 = puVar13;
            do {
              puVar41 = puVar24;
              puVar24 = puVar13 + lVar47;
              *puVar24 = *(undefined4 *)(lVar46 + lVar47);
              puVar24[1] = *(undefined4 *)(lVar14 + lVar47);
              puVar24[2] = *(undefined4 *)(lVar37 + lVar47);
              puVar24[3] = *(undefined4 *)(lVar30 + lVar47);
              lVar47 = lVar47 + 4;
              puVar24 = puVar24 + 4;
            } while (uVar45 * 4 != lVar47);
            puVar13 = puVar41 + 4;
          }
          lVar43 = lVar43 + 1;
          lVar30 = lVar30 + lVar1;
          lVar37 = lVar37 + lVar1;
          lVar14 = lVar14 + lVar1;
          lVar46 = lVar46 + lVar1;
        } while (lVar43 != lVar42);
      }
      uVar23 = uVar33 + 4;
      lVar14 = uVar33 + 7;
      iVar28 = iVar28 + iVar25;
      iVar18 = iVar18 + iVar25;
      iVar29 = iVar29 + iVar25;
      iVar35 = iVar35 + iVar25;
      uVar33 = uVar23;
    } while (lVar14 < (long)uVar36);
    uVar23 = uVar23 & 0xffffffff;
  }
  uVar21 = (uint)uVar23;
  if ((int)(uVar21 | 1) < (int)uVar3) {
    lVar37 = *(long *)(&this->field_0x148 + (long)p_Var4);
    pvVar8 = (this->weight_data_tm).data;
    sVar6 = (this->weight_data_tm).elemsize;
    sVar7 = (this->weight_data_tm).cstep;
    lVar39 = (long)(int)uVar10;
    lVar1 = lVar37 + (long)(int)(uVar2 * 7) * 4;
    iVar28 = (uVar21 | 1) * uVar2 * uVar10;
    iVar25 = uVar2 * uVar10 * 2;
    lVar47 = uVar45 * 0x20;
    lVar5 = lVar37 + (long)(int)(uVar2 * 6) * 4;
    lVar12 = lVar37 + (long)(int)(uVar2 * 5) * 4;
    lVar42 = lVar37 + (long)(int)(uVar2 * 4) * 4;
    lVar52 = lVar37 + (long)(int)(uVar2 * 3) * 4;
    lVar14 = lVar37 + (long)(int)(uVar2 * 2) * 4;
    iVar18 = uVar21 * uVar2 * uVar10;
    lVar43 = lVar51 * 0x10;
    lVar30 = lVar51 * 4;
    lVar46 = lVar37 + lVar51 * 4;
    uVar23 = uVar23 & 0xffffffff;
    do {
      lVar48 = (long)iVar28;
      lVar53 = (long)iVar18;
      puVar13 = (undefined4 *)
                ((ulong)(((uint)(uVar23 >> 2) & 1) + ((uint)(uVar23 >> 3) & 0x1fffffff) +
                        (uint)(((uint)uVar23 >> 1 & 1) != 0)) * sVar6 * sVar7 + (long)pvVar8);
      if ((int)uVar10 < 8) {
        uVar33 = 0;
      }
      else {
        lVar15 = lVar1 + lVar48 * 4;
        lVar38 = lVar5 + lVar48 * 4;
        lVar54 = lVar12 + lVar48 * 4;
        lVar31 = lVar42 + lVar48 * 4;
        lVar17 = lVar52 + lVar48 * 4;
        lVar50 = lVar14 + lVar48 * 4;
        lVar40 = lVar46 + lVar48 * 4;
        lVar44 = lVar37 + lVar48 * 4;
        lVar32 = lVar1 + lVar53 * 4;
        local_158 = lVar5 + lVar53 * 4;
        lVar16 = lVar12 + lVar53 * 4;
        local_128 = lVar42 + lVar53 * 4;
        local_130 = lVar52 + lVar53 * 4;
        local_138 = lVar14 + lVar53 * 4;
        local_140 = lVar46 + lVar53 * 4;
        local_150 = lVar37 + lVar53 * 4;
        local_120 = 0;
        do {
          if (0 < (int)uVar2) {
            lVar27 = 0;
            do {
              *puVar13 = *(undefined4 *)(local_150 + lVar27);
              puVar13[1] = *(undefined4 *)(local_140 + lVar27);
              puVar13[2] = *(undefined4 *)(local_138 + lVar27);
              puVar13[3] = *(undefined4 *)(local_130 + lVar27);
              puVar13[4] = *(undefined4 *)(local_128 + lVar27);
              puVar13[5] = *(undefined4 *)(lVar16 + lVar27);
              puVar13[6] = *(undefined4 *)(local_158 + lVar27);
              puVar13[7] = *(undefined4 *)(lVar32 + lVar27);
              puVar13[8] = *(undefined4 *)(lVar44 + lVar27);
              puVar13[9] = *(undefined4 *)(lVar40 + lVar27);
              puVar13[10] = *(undefined4 *)(lVar50 + lVar27);
              puVar13[0xb] = *(undefined4 *)(lVar17 + lVar27);
              puVar13[0xc] = *(undefined4 *)(lVar31 + lVar27);
              puVar13[0xd] = *(undefined4 *)(lVar54 + lVar27);
              puVar13[0xe] = *(undefined4 *)(lVar38 + lVar27);
              puVar13[0xf] = *(undefined4 *)(lVar15 + lVar27);
              puVar13 = puVar13 + 0x10;
              lVar27 = lVar27 + 4;
            } while (uVar45 * 4 != lVar27);
          }
          uVar33 = local_120 + 8;
          lVar27 = local_120 + 0xf;
          lVar15 = lVar15 + lVar47;
          lVar38 = lVar38 + lVar47;
          lVar54 = lVar54 + lVar47;
          lVar31 = lVar31 + lVar47;
          lVar17 = lVar17 + lVar47;
          lVar50 = lVar50 + lVar47;
          lVar40 = lVar40 + lVar47;
          lVar44 = lVar44 + lVar47;
          lVar32 = lVar32 + lVar47;
          local_158 = local_158 + lVar47;
          lVar16 = lVar16 + lVar47;
          local_128 = local_128 + lVar47;
          local_130 = local_130 + lVar47;
          local_138 = local_138 + lVar47;
          local_140 = local_140 + lVar47;
          local_150 = local_150 + lVar47;
          local_120 = uVar33;
        } while (lVar27 < lVar39);
      }
      lVar48 = lVar48 * 4;
      lVar53 = lVar53 * 4;
      if ((int)((uint)uVar33 | 3) < (int)uVar10) {
        uVar49 = uVar33 & 0xffffffff;
        lVar15 = lVar30 * uVar49 + lVar48;
        lVar38 = lVar52 + lVar15;
        lVar54 = lVar15 + lVar14;
        lVar50 = (uVar49 * 4 + 4) * lVar51;
        lVar40 = lVar48 + lVar37 + lVar50;
        lVar15 = lVar15 + lVar37;
        lVar17 = lVar30 * uVar49 + lVar53;
        lVar44 = lVar52 + lVar17;
        lVar50 = lVar50 + lVar53 + lVar37;
        lVar31 = lVar17 + lVar14;
        lVar17 = lVar17 + lVar37;
        do {
          if (0 < (int)uVar2) {
            lVar32 = 0;
            puVar24 = puVar13;
            do {
              puVar41 = puVar24;
              puVar24 = puVar13 + lVar32 * 2;
              *puVar24 = *(undefined4 *)(lVar17 + lVar32);
              puVar24[1] = *(undefined4 *)(lVar50 + lVar32);
              puVar24[2] = *(undefined4 *)(lVar31 + lVar32);
              puVar24[3] = *(undefined4 *)(lVar44 + lVar32);
              puVar24[4] = *(undefined4 *)(lVar15 + lVar32);
              puVar24[5] = *(undefined4 *)(lVar40 + lVar32);
              puVar24[6] = *(undefined4 *)(lVar54 + lVar32);
              puVar24[7] = *(undefined4 *)(lVar38 + lVar32);
              lVar32 = lVar32 + 4;
              puVar24 = puVar24 + 8;
            } while (uVar45 * 4 != lVar32);
            puVar13 = puVar41 + 8;
          }
          uVar33 = uVar49 + 4;
          lVar32 = uVar49 + 7;
          lVar38 = lVar38 + lVar43;
          lVar54 = lVar54 + lVar43;
          lVar40 = lVar40 + lVar43;
          lVar15 = lVar15 + lVar43;
          lVar44 = lVar44 + lVar43;
          lVar31 = lVar31 + lVar43;
          lVar50 = lVar50 + lVar43;
          lVar17 = lVar17 + lVar43;
          uVar49 = uVar33;
        } while (lVar32 < lVar39);
      }
      if ((int)((uint)uVar33 | 1) < (int)uVar10) {
        lVar15 = lVar30 * (uVar33 & 0xffffffff);
        lVar38 = lVar15 + lVar48 + lVar37;
        lVar15 = lVar15 + lVar53 + lVar37;
        uVar49 = uVar33 & 0xffffffff;
        do {
          if (0 < (int)uVar2) {
            uVar33 = 0;
            lVar54 = lVar15;
            lVar31 = lVar38;
            do {
              lVar17 = 0;
              bVar9 = true;
              do {
                bVar34 = bVar9;
                *puVar13 = *(undefined4 *)(lVar54 + lVar17);
                puVar13[1] = *(undefined4 *)(lVar31 + lVar17);
                puVar13 = puVar13 + 2;
                lVar17 = lVar17 + lVar30;
                bVar9 = false;
              } while (bVar34);
              uVar33 = uVar33 + 1;
              lVar31 = lVar31 + 4;
              lVar54 = lVar54 + 4;
            } while (uVar33 != uVar45);
          }
          uVar33 = uVar49 + 2;
          lVar54 = uVar49 + 3;
          lVar38 = lVar38 + lVar51 * 8;
          lVar15 = lVar15 + lVar51 * 8;
          uVar49 = uVar33;
        } while (lVar54 < lVar39);
      }
      if ((int)uVar33 < (int)uVar10) {
        lVar15 = (long)(int)uVar33;
        lVar38 = lVar48 + lVar30 * lVar15 + lVar37;
        lVar48 = lVar30 * lVar15 + lVar53 + lVar37;
        do {
          if (0 < (int)uVar2) {
            uVar33 = 0;
            do {
              *puVar13 = *(undefined4 *)(lVar48 + uVar33 * 4);
              puVar13[1] = *(undefined4 *)(lVar38 + uVar33 * 4);
              puVar13 = puVar13 + 2;
              uVar33 = uVar33 + 1;
            } while (uVar45 != uVar33);
          }
          lVar15 = lVar15 + 1;
          lVar38 = lVar38 + lVar30;
          lVar48 = lVar48 + lVar30;
        } while (lVar15 != lVar39);
      }
      uVar33 = uVar23 + 2;
      lVar48 = uVar23 + 3;
      iVar28 = iVar28 + iVar25;
      iVar18 = iVar18 + iVar25;
      uVar23 = uVar33;
    } while (lVar48 < (long)uVar36);
    uVar21 = (uint)uVar33;
  }
  if ((int)uVar21 < (int)uVar3) {
    lVar5 = *(long *)(&this->field_0x148 + (long)p_Var4);
    pvVar8 = (this->weight_data_tm).data;
    sVar6 = (this->weight_data_tm).elemsize;
    sVar7 = (this->weight_data_tm).cstep;
    lVar12 = (long)(int)uVar10;
    uVar23 = (ulong)(int)uVar21;
    iVar25 = uVar2 * uVar21 * uVar10;
    lVar1 = lVar51 * 4;
    do {
      puVar13 = (undefined4 *)
                ((ulong)(((uint)uVar23 & 1) + ((uint)(uVar23 >> 3) & 0x1fffffff) +
                         ((uint)(uVar23 >> 2) & 1) + (uint)(((uint)uVar23 >> 1 & 1) != 0)) *
                 sVar6 * sVar7 + (long)pvVar8);
      if ((int)uVar10 < 8) {
        uVar33 = 0;
      }
      else {
        puVar24 = (undefined4 *)(lVar5 + (long)iVar25 * 4);
        uVar49 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar33 = 0;
            puVar41 = puVar24;
            do {
              puVar20 = puVar13;
              lVar42 = 0;
              puVar13 = puVar41;
              do {
                *(undefined4 *)((long)puVar20 + lVar42) = *puVar13;
                lVar42 = lVar42 + 4;
                puVar13 = puVar13 + lVar51;
              } while ((int)lVar42 != 0x20);
              uVar33 = uVar33 + 1;
              puVar41 = puVar41 + 1;
              puVar13 = (undefined4 *)((long)puVar20 + lVar42);
            } while (uVar33 != uVar45);
            puVar13 = (undefined4 *)((long)puVar20 + lVar42);
          }
          uVar33 = uVar49 + 8;
          lVar42 = uVar49 + 0xf;
          puVar24 = puVar24 + uVar45 * 8;
          uVar49 = uVar33;
        } while (lVar42 < lVar12);
      }
      lVar42 = (long)iVar25 * 4;
      if ((int)((uint)uVar33 | 3) < (int)uVar10) {
        puVar24 = (undefined4 *)(lVar1 * (uVar33 & 0xffffffff) + lVar42 + lVar5);
        uVar49 = uVar33 & 0xffffffff;
        do {
          if (0 < (int)uVar2) {
            uVar33 = 0;
            puVar41 = puVar24;
            do {
              puVar20 = puVar13;
              lVar52 = 0;
              puVar13 = puVar41;
              do {
                *(undefined4 *)((long)puVar20 + lVar52) = *puVar13;
                lVar52 = lVar52 + 4;
                puVar13 = puVar13 + lVar51;
              } while ((int)lVar52 != 0x10);
              uVar33 = uVar33 + 1;
              puVar41 = puVar41 + 1;
              puVar13 = (undefined4 *)((long)puVar20 + lVar52);
            } while (uVar33 != uVar45);
            puVar13 = (undefined4 *)((long)puVar20 + lVar52);
          }
          uVar33 = uVar49 + 4;
          lVar52 = uVar49 + 7;
          puVar24 = puVar24 + lVar51 * 4;
          uVar49 = uVar33;
        } while (lVar52 < lVar12);
      }
      if ((int)((uint)uVar33 | 1) < (int)uVar10) {
        uVar49 = uVar33 & 0xffffffff;
        lVar52 = (uVar49 * 4 + 4) * lVar51 + lVar5 + lVar42;
        lVar14 = lVar1 * uVar49 + lVar42 + lVar5;
        do {
          if (0 < (int)uVar2) {
            uVar33 = 0;
            do {
              *puVar13 = *(undefined4 *)(lVar14 + uVar33 * 4);
              puVar13[1] = *(undefined4 *)(lVar52 + uVar33 * 4);
              puVar13 = puVar13 + 2;
              uVar33 = uVar33 + 1;
            } while (uVar45 != uVar33);
          }
          uVar33 = uVar49 + 2;
          lVar46 = uVar49 + 3;
          lVar52 = lVar52 + lVar51 * 8;
          lVar14 = lVar14 + lVar51 * 8;
          uVar49 = uVar33;
        } while (lVar46 < lVar12);
      }
      if ((int)uVar33 < (int)uVar10) {
        lVar52 = (long)(int)uVar33;
        lVar42 = lVar1 * lVar52 + lVar42 + lVar5;
        do {
          if (0 < (int)uVar2) {
            lVar14 = 0;
            do {
              *(undefined4 *)((long)puVar13 + lVar14) = *(undefined4 *)(lVar42 + lVar14);
              lVar14 = lVar14 + 4;
            } while (uVar45 * 4 - lVar14 != 0);
            puVar13 = (undefined4 *)((long)puVar13 + lVar14);
          }
          lVar52 = lVar52 + 1;
          lVar42 = lVar42 + lVar1;
        } while (lVar52 != lVar12);
      }
      uVar23 = uVar23 + 1;
      iVar25 = iVar25 + uVar2 * uVar10;
    } while (uVar23 != uVar36);
  }
  return 0;
}

Assistant:

int Convolution1D_x86_fma::create_pipeline(const Option& /*opt*/)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    return 0;
}